

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_muldiv(DisasContext_conflict6 *ctx,uint32_t opc,int acc,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 t3_9;
  TCGv_i64 t2_9;
  TCGv_i64 t3_8;
  TCGv_i64 t2_8;
  TCGv_i64 t3_7;
  TCGv_i64 t2_7;
  TCGv_i64 t3_6;
  TCGv_i64 t2_6;
  TCGv_i64 t3_5;
  TCGv_i64 t2_5;
  TCGv_i64 t3_4;
  TCGv_i64 t2_4;
  TCGv_i32 t3_3;
  TCGv_i32 t2_3;
  TCGv_i32 t3_2;
  TCGv_i32 t2_2;
  TCGv_i64 t3_1;
  TCGv_i64 t2_1;
  TCGv_i64 t3;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rs_local;
  int acc_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_load_gpr(tcg_ctx_00,t,rs);
  gen_load_gpr(tcg_ctx_00,t_00,rt);
  if (acc != 0) {
    check_dsp(ctx);
  }
  if (opc == 0x18) {
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
    tcg_gen_muls2_i32_mips64el(tcg_ctx_00,pTVar1,pTVar2,pTVar1,pTVar2);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],pTVar1);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
  }
  else if (opc == 0x19) {
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
    tcg_gen_mulu2_i32_mips64el(tcg_ctx_00,pTVar1,pTVar2,pTVar1,pTVar2);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],pTVar1);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
  }
  else if (opc == 0x1a) {
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t,t);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t_00,t_00);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar3,t,-0x80000000);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,-1);
    tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,0);
    tcg_gen_or_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,pTVar4,0);
    tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t_00,pTVar3,pTVar4,pTVar3,t_00);
    tcg_gen_div_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],t,t_00);
    tcg_gen_rem_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],t,t_00);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_LO[acc]);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],tcg_ctx_00->cpu_HI[acc]);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else if (opc == 0x1b) {
    pTVar3 = tcg_const_i64_mips64el(tcg_ctx_00,0);
    pTVar4 = tcg_const_i64_mips64el(tcg_ctx_00,1);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t_00,t_00);
    tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,t_00,t_00,pTVar3,pTVar4,t_00);
    tcg_gen_divu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],t,t_00);
    tcg_gen_remu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],t,t_00);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_LO[acc]);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],tcg_ctx_00->cpu_HI[acc]);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else if (opc == 0x1c) {
    tcg_gen_muls2_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_HI[acc],t,t_00);
  }
  else if (opc == 0x1d) {
    tcg_gen_mulu2_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_HI[acc],t,t_00);
  }
  else if (opc == 0x1e) {
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar3,t,-0x8000000000000000);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,-1);
    tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,0);
    tcg_gen_or_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,pTVar4,0);
    tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t_00,pTVar3,pTVar4,pTVar3,t_00);
    tcg_gen_div_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],t,t_00);
    tcg_gen_rem_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],t,t_00);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else if (opc == 0x1f) {
    pTVar3 = tcg_const_i64_mips64el(tcg_ctx_00,0);
    pTVar4 = tcg_const_i64_mips64el(tcg_ctx_00,1);
    tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,t_00,t_00,pTVar3,pTVar4,t_00);
    tcg_gen_divu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],t,t_00);
    tcg_gen_remu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],t,t_00);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else if (opc == 0x70000000) {
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar3,t);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar4,t_00);
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_concat32_i64(tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_HI[acc]);
    tcg_gen_add_i64(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],pTVar3);
    gen_move_high32(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],pTVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else if (opc == 0x70000001) {
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t_00,t_00);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar3,t);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar4,t_00);
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_concat32_i64(tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_HI[acc]);
    tcg_gen_add_i64(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],pTVar3);
    gen_move_high32(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],pTVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else if (opc == 0x70000004) {
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar3,t);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar4,t_00);
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_concat32_i64(tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_HI[acc]);
    tcg_gen_sub_i64(tcg_ctx_00,pTVar3,pTVar4,pTVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],pTVar3);
    gen_move_high32(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],pTVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else if (opc == 0x70000005) {
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t_00,t_00);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar3,t);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,pTVar4,t_00);
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
    tcg_gen_concat32_i64(tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_LO[acc],tcg_ctx_00->cpu_HI[acc]);
    tcg_gen_sub_i64(tcg_ctx_00,pTVar3,pTVar4,pTVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar4);
    gen_move_low32(tcg_ctx_00,tcg_ctx_00->cpu_LO[acc],pTVar3);
    gen_move_high32(tcg_ctx_00,tcg_ctx_00->cpu_HI[acc],pTVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  return;
}

Assistant:

static void gen_muldiv(DisasContext *ctx, uint32_t opc,
                       int acc, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    if (acc != 0) {
        check_dsp(ctx);
    }

    switch (opc) {
    case OPC_DIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_LO[acc]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_HI[acc]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_LO[acc]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_HI[acc]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_MULT:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case OPC_MULTU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DDIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DDIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_remu_i64(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DMULT:
        tcg_gen_muls2_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc], t0, t1);
        break;
    case OPC_DMULTU:
        tcg_gen_mulu2_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc], t0, t1);
        break;
#endif
    case OPC_MADD:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MADDU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MSUB:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_sub_i64(tcg_ctx, t2, t3, t2);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MSUBU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_sub_i64(tcg_ctx, t2, t3, t2);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    default:
        MIPS_INVAL("mul/div");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}